

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::splitDockWidget
          (QDockAreaLayout *this,QDockWidget *after,QDockWidget *dockWidget,Orientation orientation)

{
  long lVar1;
  bool bVar2;
  QDockAreaLayout *this_00;
  undefined4 in_ECX;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *info;
  QList<int> path;
  QDockWidget *in_stack_ffffffffffffff78;
  QList<int> *in_stack_ffffffffffffff90;
  QWidget *in_stack_ffffffffffffffa0;
  QDockAreaLayout *this_01;
  undefined4 in_stack_ffffffffffffffa8;
  QDockAreaLayout *dockWidgetItem;
  Orientation in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dockWidgetItem = in_RDI;
  indexOf((QDockAreaLayout *)CONCAT44(in_ECX,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x57bc96);
  if (!bVar2) {
    this_00 = (QDockAreaLayout *)QDockAreaLayout::info(in_RDI,in_stack_ffffffffffffff90);
    this_01 = this_00;
    QList<int>::last((QList<int> *)in_stack_ffffffffffffff78);
    operator_new(0x18);
    QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_00,in_stack_ffffffffffffff78);
    QDockAreaLayoutInfo::split
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
               (QLayoutItem *)dockWidgetItem);
    QObject::objectName();
    removePlaceHolder(this_01,(QString *)in_RDI);
    QString::~QString((QString *)0x57bd3a);
  }
  QList<int>::~QList((QList<int> *)0x57bd4c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::splitDockWidget(QDockWidget *after,
                                               QDockWidget *dockWidget,
                                               Qt::Orientation orientation)
{
    const QList<int> path = indexOf(after);
    if (path.isEmpty())
        return;

    QDockAreaLayoutInfo *info = this->info(path);
    Q_ASSERT(info != nullptr);
    info->split(path.last(), orientation, new QDockWidgetItem(dockWidget));

    removePlaceHolder(dockWidget->objectName());
}